

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextOutputStream.cpp
# Opt level: O0

void __thiscall
binlog::TextOutputStream::TextOutputStream
          (TextOutputStream *this,ostream *out,string *eventFormat,string *dateFormat)

{
  string *in_RCX;
  string *in_RDX;
  pointer in_RSI;
  EventStream *in_RDI;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  PrettyPrinter *in_stack_ffffffffffffffa0;
  string local_40 [64];
  
  (in_RDI->_eventSources)._offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = in_RSI;
  EventStream::EventStream(in_RDI);
  std::__cxx11::string::string(local_40,in_RDX);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,in_RCX);
  PrettyPrinter::PrettyPrinter
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

TextOutputStream::TextOutputStream(std::ostream& out, std::string eventFormat, std::string dateFormat)
  :_out(out),
   _printer(std::move(eventFormat), std::move(dateFormat))
{}